

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_spawn.cpp
# Opt level: O1

void test5(void)

{
  uint in_EAX;
  int j;
  long lVar1;
  long lVar2;
  int (*paiVar3) [32];
  undefined8 uStack_38;
  
  uStack_38._0_4_ = in_EAX;
  t0.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  uStack_38 = (ulong)(uint)uStack_38;
  depspawn::spawn<void(int,int),int,int&>(rec2,(int *)((long)&uStack_38 + 4),&nsize);
  t1.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  depspawn::wait_for_all();
  t2.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  if (0 < nsize) {
    lVar2 = 0;
    paiVar3 = mx;
    do {
      if (mx[lVar2][0] != 1) {
        retstate = -1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error\n",6);
      }
      mx[lVar2][0] = 0;
      lVar1 = 1;
      do {
        if ((*paiVar3)[lVar1] != 0) {
          retstate = -1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error\n",6);
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 != 8);
      lVar2 = lVar2 + 1;
      paiVar3 = paiVar3 + 1;
    } while (lVar2 < nsize);
  }
  pr("f(frozen int) rec2");
  return;
}

Assistant:

void test5() 
{
  
  t0 = std::chrono::high_resolution_clock::now();
  
  spawn(rec2, 0, nsize);
  
  t1 = std::chrono::high_resolution_clock::now();
  
  wait_for_all();
  
  t2 = std::chrono::high_resolution_clock::now();
  
  for(int i = 0; i < nsize; i++) {
    if(mx[i][0] != 1) doerror();
    mx[i][0] = 0;
    for (int j=1; j < 8; ++j)
      if(mx[i][j] != 0) doerror();
  }
  
  pr("f(frozen int) rec2");
  
}